

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O0

decNumber * uprv_decNumberInvert_63(decNumber *res,decNumber *rhs,decContext *set)

{
  int iVar1;
  uint uVar2;
  int32_t iVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  uint local_7c;
  uint local_74;
  uint local_64;
  int local_54;
  int32_t j;
  int32_t i;
  uint8_t a;
  int32_t msudigs;
  uint8_t *msuc;
  uint8_t *uc;
  uint8_t *msua;
  uint8_t *ua;
  decContext *set_local;
  decNumber *rhs_local;
  decNumber *res_local;
  
  if (((rhs->exponent == 0) && ((rhs->bits & 0x70) == 0)) && ((rhs->bits & 0x80) == 0)) {
    msua = rhs->lsu;
    msuc = res->lsu;
    if (rhs->digits < 0x32) {
      local_64 = (uint)""[rhs->digits];
    }
    else {
      local_64 = rhs->digits / 1;
    }
    puVar4 = msua + (long)(int)local_64 + -1;
    if (set->digits < 0x32) {
      local_74 = (uint)""[set->digits];
    }
    else {
      local_74 = set->digits / 1;
    }
    puVar5 = msuc + (long)(int)local_74 + -1;
    iVar1 = set->digits;
    if (set->digits < 0x32) {
      local_7c = (uint)""[set->digits];
    }
    else {
      local_7c = set->digits / 1;
    }
    for (; msuc <= puVar5; msuc = msuc + 1) {
      if (puVar4 < msua) {
        j._3_1_ = 0;
      }
      else {
        j._3_1_ = *msua;
      }
      *msuc = '\0';
      for (local_54 = 0; local_54 < 1; local_54 = local_54 + 1) {
        if (((j._3_1_ ^ 0xff) & 1) != 0) {
          *msuc = *msuc + (char)DECPOWERS[local_54];
        }
        uVar2 = (uint)j._3_1_;
        j._3_1_ = j._3_1_ / 10;
        if (1 < uVar2 % 10) {
          decStatus(res,0x80,set);
          return res;
        }
        if ((msuc == puVar5) && (local_54 == (iVar1 - (local_7c - 1)) + -1)) break;
      }
      msua = msua + 1;
    }
    iVar3 = decGetDigits(res->lsu,(int)msuc - ((int)res + 9));
    res->digits = iVar3;
    res->exponent = 0;
    res->bits = '\0';
  }
  else {
    decStatus(res,0x80,set);
  }
  return res;
}

Assistant:

U_CAPI decNumber * U_EXPORT2 uprv_decNumberInvert(decNumber *res, const decNumber *rhs,
                            decContext *set) {
  const Unit *ua, *msua;                /* -> operand and its msu  */
  Unit  *uc, *msuc;                     /* -> result and its msu  */
  Int   msudigs;                        /* digits in res msu  */
  #if DECCHECK
  if (decCheckOperands(res, DECUNUSED, rhs, set)) return res;
  #endif

  if (rhs->exponent!=0 || decNumberIsSpecial(rhs) || decNumberIsNegative(rhs)) {
    decStatus(res, DEC_Invalid_operation, set);
    return res;
    }
  /* operand is valid  */
  ua=rhs->lsu;                          /* bottom-up  */
  uc=res->lsu;                          /* ..  */
  msua=ua+D2U(rhs->digits)-1;           /* -> msu of rhs  */
  msuc=uc+D2U(set->digits)-1;           /* -> msu of result  */
  msudigs=MSUDIGITS(set->digits);       /* [faster than remainder]  */
  for (; uc<=msuc; ua++, uc++) {        /* Unit loop  */
    Unit a;                             /* extract unit  */
    Int  i, j;                          /* work  */
    if (ua>msua) a=0;
     else a=*ua;
    *uc=0;                              /* can now write back  */
    /* always need to examine all bits in rhs  */
    /* This loop could be unrolled and/or use BIN2BCD tables  */
    for (i=0; i<DECDPUN; i++) {
      if ((~a)&1) *uc=*uc+(Unit)powers[i];   /* effect INVERT  */
      j=a%10;
      a=a/10;
      if (j>1) {
        decStatus(res, DEC_Invalid_operation, set);
        return res;
        }
      if (uc==msuc && i==msudigs-1) break;   /* just did final digit  */
      } /* each digit  */
    } /* each unit  */
  /* [here uc-1 is the msu of the result]  */
  res->digits=decGetDigits(res->lsu, static_cast<int32_t>(uc - res->lsu));
  res->exponent=0;                      /* integer  */
  res->bits=0;                          /* sign=0  */
  return res;  /* [no status to set]  */
  }